

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

bool openZoneInfo(QString *name,QFile *file)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  long *in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView zoneLib;
  QLatin1StringView zoneShare;
  QString tzdir;
  undefined4 in_stack_fffffffffffffe48;
  OpenModeFlag in_stack_fffffffffffffe4c;
  QLatin1String *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  QFile *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe78;
  QString *in_stack_fffffffffffffe88;
  QDir *in_stack_fffffffffffffe90;
  bool local_161;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  QDir *in_stack_fffffffffffffeb0;
  bool local_121;
  bool local_e5;
  undefined4 local_e4;
  undefined4 local_94;
  undefined4 local_44;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qEnvironmentVariable(in_stack_fffffffffffffe78);
  bVar2 = QString::isEmpty((QString *)0x74a706);
  if (!bVar2) {
    QDir::QDir(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    QDir::filePath(in_stack_fffffffffffffeb0,
                   (QString *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    QFile::setFileName(in_stack_fffffffffffffe60,
                       (QString *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0x74a778);
    QDir::~QDir((QDir *)0x74a785);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c);
    bVar3 = (**(code **)(*in_RSI + 0x68))(in_RSI,local_44);
    if ((bVar3 & 1) != 0) {
      local_e5 = true;
      goto LAB_0074abd2;
    }
  }
  bVar2 = operator!=((QString *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe50);
  local_121 = false;
  if (bVar2) {
    QLatin1String::chopped
              ((QLatin1String *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               (qsizetype)in_stack_fffffffffffffe50);
    local_121 = operator!=((QString *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                           in_stack_fffffffffffffe50);
  }
  if (local_121 != false) {
    operator+(in_stack_fffffffffffffe50,
              (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QLatin1String_&,_const_QString_&> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QFile::setFileName(in_stack_fffffffffffffe60,
                       (QString *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0x74a995);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c);
    bVar3 = (**(code **)(*in_RSI + 0x68))(in_RSI,local_94);
    if ((bVar3 & 1) != 0) {
      local_e5 = true;
      goto LAB_0074abd2;
    }
  }
  bVar2 = operator!=((QString *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe50);
  local_161 = false;
  if (bVar2) {
    QLatin1String::chopped
              ((QLatin1String *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               (qsizetype)in_stack_fffffffffffffe50);
    local_161 = operator!=((QString *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                           in_stack_fffffffffffffe50);
  }
  if (local_161 != false) {
    operator+(in_stack_fffffffffffffe50,
              (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QLatin1String_&,_const_QString_&> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QFile::setFileName(in_stack_fffffffffffffe60,
                       (QString *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0x74ab3d);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c);
    bVar3 = (**(code **)(*in_RSI + 0x68))(in_RSI,local_e4);
    if ((bVar3 & 1) != 0) {
      local_e5 = true;
      goto LAB_0074abd2;
    }
  }
  local_e5 = false;
LAB_0074abd2:
  QString::~QString((QString *)0x74abdf);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_e5;
}

Assistant:

static bool openZoneInfo(const QString &name, QFile *file)
{
    // At least on Linux / glibc (see man 3 tzset), $TZDIR overrides the system
    // default location for zone info:
    const QString tzdir = qEnvironmentVariable("TZDIR");
    if (!tzdir.isEmpty()) {
        file->setFileName(QDir(tzdir).filePath(name));
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    // Try modern system path first:
    constexpr auto zoneShare = "/usr/share/zoneinfo/"_L1;
    if (tzdir != zoneShare && tzdir != zoneShare.chopped(1)) {
        file->setFileName(zoneShare + name);
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    // Fall back to legacy system path:
    constexpr auto zoneLib = "/usr/lib/zoneinfo/"_L1;
    if (tzdir != zoneLib && tzdir != zoneLib.chopped(1)) {
        file->setFileName(zoneShare + name);
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    return false;
}